

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void google::protobuf::compiler::php::GenerateFile
               (FileDescriptor *file,bool is_descriptor,GeneratorContext *generator_context)

{
  long lVar1;
  long lVar2;
  
  GenerateMetadataFile(file,is_descriptor,generator_context);
  if (0 < *(int *)(file + 0x2c)) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      GenerateMessageFile(file,(Descriptor *)(*(long *)(file + 0x68) + lVar1),is_descriptor,
                          generator_context);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x90;
    } while (lVar2 < *(int *)(file + 0x2c));
  }
  if (0 < *(int *)(file + 0x30)) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      GenerateEnumFile(file,(EnumDescriptor *)(*(long *)(file + 0x70) + lVar1),is_descriptor,
                       generator_context);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x50;
    } while (lVar2 < *(int *)(file + 0x30));
  }
  if ((*(char *)(*(long *)(file + 0x88) + 0x9e) == '\x01') && (0 < *(int *)(file + 0x34))) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      GenerateServiceFile(file,(ServiceDescriptor *)(*(long *)(file + 0x78) + lVar2),is_descriptor,
                          generator_context);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x30;
    } while (lVar1 < *(int *)(file + 0x34));
  }
  return;
}

Assistant:

void GenerateFile(const FileDescriptor* file, bool is_descriptor,
                  GeneratorContext* generator_context) {
  GenerateMetadataFile(file, is_descriptor, generator_context);
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateMessageFile(file, file->message_type(i), is_descriptor,
                        generator_context);
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnumFile(file, file->enum_type(i), is_descriptor,
                     generator_context);
  }
  if (file->options().php_generic_services()) {
    for (int i = 0; i < file->service_count(); i++) {
      GenerateServiceFile(file, file->service(i), is_descriptor,
                       generator_context);
    }
  }
}